

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# A_socket.h
# Opt level: O0

void __thiscall adapter::ASocket::ASocket(ASocket *this)

{
  shared_ptr<adapter::APlug> local_20;
  ASocket *local_10;
  ASocket *this_local;
  
  this->_vptr_ASocket = (_func_int **)&PTR_charge_0019e6a0;
  local_10 = this;
  std::shared_ptr<adapter::APlug>::shared_ptr(&this->paplug_);
  std::make_shared<adapter::APlug>();
  std::shared_ptr<adapter::APlug>::operator=(&this->paplug_,&local_20);
  std::shared_ptr<adapter::APlug>::~shared_ptr(&local_20);
  return;
}

Assistant:

ASocket::ASocket(/* args */) {
    paplug_ = std::make_shared<APlug>();
}